

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AudioPluginUtil.h
# Opt level: O2

bool __thiscall
RingBuffer<1000,_ImpactGenerator::Impact>::Read
          (RingBuffer<1000,_ImpactGenerator::Impact> *this,Impact *val)

{
  Impact *pIVar1;
  int iVar2;
  int iVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  int iVar7;
  
  iVar2 = this->readpos;
  iVar3 = this->writepos;
  if (iVar2 != iVar3) {
    iVar7 = 0;
    if (iVar2 != 999) {
      iVar7 = iVar2 + 1;
    }
    fVar4 = this->buffer[iVar7].bw;
    val->cut = this->buffer[iVar7].cut;
    val->bw = fVar4;
    pIVar1 = this->buffer + iVar7;
    fVar4 = pIVar1->decay;
    fVar5 = pIVar1->lpf;
    fVar6 = pIVar1->bpf;
    val->volume = pIVar1->volume;
    val->decay = fVar4;
    val->lpf = fVar5;
    val->bpf = fVar6;
    this->readpos = iVar7;
  }
  return iVar2 != iVar3;
}

Assistant:

inline bool Read(T& val)
    {
        int r = readpos;
        if (r == writepos)
            return false;
        r = (r == LENGTH - 1) ? 0 : (r + 1);
        val = buffer[r];
        readpos = r;
        return true;
    }